

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O1

RC __thiscall QL_Manager::RunDelete(QL_Manager *this,QL_Node *topNode)

{
  int iVar1;
  bool bVar2;
  RC RVar3;
  int extraout_EAX;
  DataAttrInfo *attributes;
  Attr *attributes_00;
  long lVar4;
  int iVar5;
  long lVar6;
  IX_IndexHandle *pIVar7;
  IX_IndexHandle *this_00;
  RID rid;
  int attrListSize;
  char *pData;
  RM_Record rec;
  int finalTupLength;
  Printer printer;
  int *attrList;
  RM_FileHandle relFH;
  RID local_ec;
  int local_e4;
  IX_IndexHandle *local_e0;
  Attr *local_d8;
  char *local_d0;
  RM_Record local_c8;
  int local_ac;
  Printer local_a8;
  int *local_80;
  RM_FileHandle local_78;
  
  QL_Node::GetTupleLength(topNode,&local_ac);
  RVar3 = QL_Node::GetAttrList(topNode,&local_80,&local_e4);
  if (RVar3 == 0) {
    attributes = (DataAttrInfo *)malloc((long)local_e4 * 0x44);
    RVar3 = SetUpPrinter(this,topNode,attributes);
    if (RVar3 == 0) {
      Printer::Printer(&local_a8,attributes,local_e4);
      Printer::PrintHeader(&local_a8,(ostream *)&std::cout);
      RM_FileHandle::RM_FileHandle(&local_78);
      attributes_00 = (Attr *)malloc((long)this->relEntries->attrCount * 0x30);
      RVar3 = SetUpRun(this,attributes_00,&local_78);
      if (RVar3 == 0) {
        RVar3 = (**topNode->_vptr_QL_Node)(topNode);
        if (RVar3 == 0) {
          RM_Record::RM_Record(&local_c8);
          RID::RID(&local_ec);
          this_00 = &attributes_00->ih;
          iVar5 = RVar3;
          do {
            RVar3 = (*topNode->_vptr_QL_Node[2])(topNode,&local_c8);
            if (RVar3 != 0) {
              if (((RVar3 == 0x199) && (RVar3 = (*topNode->_vptr_QL_Node[3])(topNode), RVar3 == 0))
                 && (RVar3 = CleanUpRun(this,attributes_00,&local_78), RVar3 == 0)) {
                Printer::PrintFooter(&local_a8,(ostream *)&std::cout);
                free(attributes);
                RVar3 = 0;
              }
              break;
            }
            RVar3 = RM_Record::GetRid(&local_c8,&local_ec);
            pIVar7 = this_00;
            if ((RVar3 == 0) && (RVar3 = RM_Record::GetData(&local_c8,&local_d0), RVar3 == 0)) {
              Printer::Print(&local_a8,(ostream *)&std::cout,local_d0);
              RVar3 = RM_FileHandle::DeleteRec(&local_78,&local_ec);
              if (RVar3 != 0) goto LAB_0011130e;
              iVar1 = this->relEntries->attrCount;
              bVar2 = iVar1 < 1;
              RVar3 = iVar5;
              if (0 < iVar1) {
                lVar6 = 0;
                local_e0 = this_00;
                local_d8 = attributes_00;
                do {
                  if ((*(int *)(this_00 + -4) != -1) &&
                     (IX_IndexHandle::DeleteEntry(this_00), extraout_EAX != 0)) {
                    bVar2 = false;
                    attributes_00 = local_d8;
                    pIVar7 = local_e0;
                    RVar3 = extraout_EAX;
                    break;
                  }
                  lVar6 = lVar6 + 1;
                  lVar4 = (long)this->relEntries->attrCount;
                  this_00 = this_00 + 0x30;
                  bVar2 = lVar4 <= lVar6;
                  attributes_00 = local_d8;
                  pIVar7 = local_e0;
                } while (lVar6 < lVar4);
              }
            }
            else {
LAB_0011130e:
              bVar2 = false;
            }
            this_00 = pIVar7;
            iVar5 = RVar3;
          } while (bVar2);
          RID::~RID(&local_ec);
          RM_Record::~RM_Record(&local_c8);
        }
      }
      else {
        SM_Manager::CleanUpAttr(this->smm,attributes_00,this->relEntries->attrCount);
      }
      RM_FileHandle::~RM_FileHandle(&local_78);
      Printer::~Printer(&local_a8);
    }
  }
  return RVar3;
}

Assistant:

RC QL_Manager::RunDelete(QL_Node *topNode){
  RC rc = 0;
  // Retrieves the list of attributes associated with this relation, and set up the
  // printer
  int finalTupLength, attrListSize;
  topNode->GetTupleLength(finalTupLength);
  int *attrList;
  if((rc = topNode->GetAttrList(attrList, attrListSize)))
    return (rc);
  DataAttrInfo * printAttributes = (DataAttrInfo *)malloc(attrListSize* sizeof(DataAttrInfo));
  if((rc = SetUpPrinter(topNode, printAttributes)))
    return (rc);
  Printer printer(printAttributes, attrListSize);
  printer.PrintHeader(cout);

  // Open the appropriate file, and Attr* list for holding IX_IndexHandles
  // for efficient index updates
  RM_FileHandle relFH;
  Attr* attributes = (Attr *)malloc(sizeof(Attr)*relEntries->attrCount);
  if((rc = SetUpRun(attributes, relFH))){
    smm.CleanUpAttr(attributes, relEntries->attrCount);
    return (rc);
  } 
  
  // Retrieves records
  if((rc = topNode->OpenIt() ))
    return (rc);

  RM_Record rec;
  RID rid;
  while(true){
    if((rc = topNode->GetNextRec(rec))){
      if (rc == QL_EOI){
        break;
      }
      return (rc);
    }
    char *pData;
    if((rc = rec.GetRid(rid)) || (rc = rec.GetData(pData)) )
      return (rc);
    printer.Print(cout, pData); // print out info about the attribute to delete
    if((rc = relFH.DeleteRec(rid))) // delete it
      return (rc);
    
    // Delete it from any index as well
    for(int i=0; i < relEntries->attrCount ; i++){
      if(attributes[i].indexNo != -1){
        if((rc = attributes[i].ih.DeleteEntry((void *)(pData + attributes[i].offset), rid)))
          return (rc);
      }
    }
  }
  
  if((rc = topNode->CloseIt()))
    return (rc);


  if((rc = CleanUpRun(attributes, relFH)))
    return (rc);

  printer.PrintFooter(cout);
  free(printAttributes);

  return (0);
}